

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_op(DisasContext *s1,int op,MemOp ot,int d)

{
  uc_struct_conflict *val;
  TCGContext *pTVar1;
  TCGArg a2;
  void *pvVar2;
  target_ulong tVar3;
  uintptr_t o_6;
  TCGTemp *ts;
  list_item *plVar4;
  TCGv_i64 pTVar5;
  TCGv_i64 pTVar6;
  TCGv_i64 pTVar7;
  TCGv_i32 pTVar8;
  TCGv_i64 pTVar9;
  CCOp op_00;
  uintptr_t o_7;
  TCGOpcode opc;
  TCGv_i64 pTVar10;
  uintptr_t o_8;
  TCGContext *tcg_ctx;
  bool bVar11;
  TCGTemp *local_68;
  TCGv_i64 local_60;
  TCGv_i64 local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  val = s1->uc;
  pTVar1 = val->tcg_ctx;
  if (d == 0x10) {
    if ((s1->prefix & 4U) == 0) {
      pTVar9 = s1->A0;
      pTVar10 = s1->T0;
      if (val->hook[10].head != (list_item *)0x0) {
        a2 = s1->prev_pc;
        ts = tcg_temp_new_internal_x86_64(pTVar1,TCG_TYPE_I64,false);
        tcg_gen_op2_x86_64(pTVar1,INDEX_op_movi_i64,(TCGArg)ts,a2);
        tcg_gen_op3_x86_64(pTVar1,INDEX_op_st_i64,(TCGArg)ts,
                           (TCGArg)(pTVar1->cpu_env + (long)pTVar1),0x80);
        tcg_temp_free_internal_x86_64(pTVar1,ts);
      }
      tcg_gen_qemu_ld_i64_x86_64(pTVar1,pTVar10,pTVar9,(long)s1->mem_index,ot);
    }
  }
  else {
    if ((s1->prefix & 4U) != 0) {
      gen_exception(s1,6,s1->pc_start - s1->cs_base);
      return;
    }
    pTVar9 = s1->T0;
    if ((d - 8U < 0xfffffffc || ot != MO_8) || (s1->x86_64_hregs != false)) {
      if (pTVar1->cpu_regs[d] != pTVar9) {
        tcg_gen_op2_x86_64(pTVar1,INDEX_op_mov_i64,(TCGArg)(pTVar9 + (long)pTVar1),
                           (TCGArg)(pTVar1->cpu_regs[d] + (long)pTVar1));
      }
    }
    else {
      tcg_gen_extract_i64_x86_64(pTVar1,pTVar9,pTVar1->cpu_regs[d - 4],8,8);
    }
  }
  switch(op) {
  case 0:
    if ((s1->prefix & 4) == 0) {
      pTVar9 = s1->T0 + (long)pTVar1;
      tcg_gen_op3_x86_64(pTVar1,INDEX_op_add_i64,(TCGArg)pTVar9,(TCGArg)pTVar9,
                         (TCGArg)(s1->T1 + (long)pTVar1));
      gen_op_st_rm_T0_A0(s1,ot,d);
    }
    else {
      tcg_gen_atomic_add_fetch_i64_x86_64(pTVar1,s1->T0,s1->A0,s1->T1,(long)s1->mem_index,ot);
    }
    gen_op_update2_cc(s1);
    op_00 = ot + MO_LESL;
    goto LAB_005329eb;
  case 1:
    if ((s1->prefix & 4) == 0) {
      pTVar9 = s1->T0 + (long)pTVar1;
      pTVar10 = s1->T1 + (long)pTVar1;
      opc = INDEX_op_or_i64;
LAB_005324fb:
      tcg_gen_op3_x86_64(pTVar1,opc,(TCGArg)pTVar9,(TCGArg)pTVar9,(TCGArg)pTVar10);
      gen_op_st_rm_T0_A0(s1,ot,d);
    }
    else {
      tcg_gen_atomic_or_fetch_i64_x86_64(pTVar1,s1->T0,s1->A0,s1->T1,(long)s1->mem_index,ot);
    }
    break;
  case 2:
    gen_setcc1(s1,2,s1->tmp4);
    if ((s1->prefix & 4) == 0) {
      pTVar9 = s1->T0 + (long)pTVar1;
      tcg_gen_op3_x86_64(pTVar1,INDEX_op_add_i64,(TCGArg)pTVar9,(TCGArg)pTVar9,
                         (TCGArg)(s1->T1 + (long)pTVar1));
      tcg_gen_op3_x86_64(pTVar1,INDEX_op_add_i64,(TCGArg)(s1->T0 + (long)pTVar1),
                         (TCGArg)(s1->T0 + (long)pTVar1),(TCGArg)(s1->tmp4 + (long)pTVar1));
      gen_op_st_rm_T0_A0(s1,ot,d);
    }
    else {
      tcg_gen_op3_x86_64(pTVar1,INDEX_op_add_i64,(TCGArg)(s1->T0 + (long)pTVar1),
                         (TCGArg)(s1->tmp4 + (long)pTVar1),(TCGArg)(s1->T1 + (long)pTVar1));
      tcg_gen_atomic_add_fetch_i64_x86_64(pTVar1,s1->T0,s1->A0,s1->T0,(long)s1->mem_index,ot);
    }
    gen_op_update3_cc(s1,s1->tmp4);
    op_00 = ot + MO_BEUL;
    goto LAB_005329eb;
  case 3:
    gen_setcc1(s1,2,s1->tmp4);
    pTVar9 = s1->T0;
    if ((s1->prefix & 4) == 0) {
      tcg_gen_sub_i64(pTVar1,pTVar9,pTVar9,s1->T1);
      tcg_gen_sub_i64(pTVar1,s1->T0,s1->T0,s1->tmp4);
      gen_op_st_rm_T0_A0(s1,ot,d);
    }
    else {
      tcg_gen_op3_x86_64(pTVar1,INDEX_op_add_i64,(TCGArg)(pTVar9 + (long)pTVar1),
                         (TCGArg)(s1->T1 + (long)pTVar1),(TCGArg)(s1->tmp4 + (long)pTVar1));
      tcg_gen_op2_x86_64(pTVar1,INDEX_op_neg_i64,(TCGArg)(s1->T0 + (long)pTVar1),
                         (TCGArg)(s1->T0 + (long)pTVar1));
      tcg_gen_atomic_add_fetch_i64_x86_64(pTVar1,s1->T0,s1->A0,s1->T0,(long)s1->mem_index,ot);
    }
    gen_op_update3_cc(s1,s1->tmp4);
    op_00 = ot + (MO_ALIGN_2|MO_32);
    goto LAB_005329eb;
  default:
    if ((s1->prefix & 4) == 0) {
      pTVar9 = s1->T0 + (long)pTVar1;
      pTVar10 = s1->T1 + (long)pTVar1;
      opc = INDEX_op_and_i64;
      goto LAB_005324fb;
    }
    tcg_gen_atomic_and_fetch_i64_x86_64(pTVar1,s1->T0,s1->A0,s1->T1,(long)s1->mem_index,ot);
    break;
  case 5:
    if ((s1->prefix & 4) == 0) {
      if (s1->cc_srcT != s1->T0) {
        tcg_gen_op2_x86_64(pTVar1,INDEX_op_mov_i64,(TCGArg)(s1->cc_srcT + (long)pTVar1),
                           (TCGArg)(s1->T0 + (long)pTVar1));
      }
      tcg_gen_sub_i64(pTVar1,s1->T0,s1->T0,s1->T1);
      gen_op_st_rm_T0_A0(s1,ot,d);
    }
    else {
      tcg_gen_op2_x86_64(pTVar1,INDEX_op_neg_i64,(TCGArg)(s1->T0 + (long)pTVar1),
                         (TCGArg)(s1->T1 + (long)pTVar1));
      tcg_gen_atomic_fetch_add_i64_x86_64(pTVar1,s1->cc_srcT,s1->A0,s1->T0,(long)s1->mem_index,ot);
      tcg_gen_sub_i64(pTVar1,s1->T0,s1->cc_srcT,s1->T1);
    }
    plVar4 = val->hook[0x10].head;
    bVar11 = plVar4 != (list_item *)0x0;
    if (bVar11) {
      do {
        pvVar2 = plVar4->data;
        if ((((*(ulong *)((long)pvVar2 + 0x18) <= s1->pc_start) &&
             (s1->pc_start <= *(ulong *)((long)pvVar2 + 0x20))) ||
            (*(ulong *)((long)pvVar2 + 0x20) < *(ulong *)((long)pvVar2 + 0x18))) &&
           (*(char *)((long)pvVar2 + 0x14) != '\x01')) break;
        plVar4 = plVar4->next;
        bVar11 = plVar4 != (list_item *)0x0;
      } while (bVar11);
    }
    if ((bVar11) && (plVar4 = val->hook[0x10].head, plVar4 != (list_item *)0x0)) {
      do {
        pvVar2 = plVar4->data;
        if (pvVar2 == (void *)0x0) break;
        if (((*(char *)((long)pvVar2 + 0x14) == '\0') && (*(int *)((long)pvVar2 + 0xc) == 0)) &&
           ((*(byte *)((long)pvVar2 + 0x10) & 2) != 0)) {
          tVar3 = s1->pc_start;
          pTVar9 = s1->T0;
          pTVar10 = s1->T1;
          pTVar5 = tcg_const_i64_x86_64(pTVar1,(int64_t)pvVar2);
          pTVar6 = tcg_const_i64_x86_64(pTVar1,(int64_t)val);
          pTVar7 = tcg_const_i64_x86_64(pTVar1,tVar3);
          pTVar8 = tcg_const_i32_x86_64(pTVar1,8 << ((byte)ot & 3));
          local_68 = (TCGTemp *)(pTVar5 + (long)pTVar1);
          local_60 = pTVar9 + (long)pTVar1;
          local_58 = pTVar10 + (long)pTVar1;
          local_50 = (TCGTemp *)(pTVar8 + (long)pTVar1);
          local_48 = (TCGTemp *)(pTVar6 + (long)pTVar1);
          local_40 = (TCGTemp *)(pTVar7 + (long)pTVar1);
          tcg_gen_callN_x86_64(pTVar1,helper_uc_traceopcode,(TCGTemp *)0x0,6,&local_68);
          tcg_temp_free_internal_x86_64(pTVar1,(TCGTemp *)(pTVar8 + (long)pTVar1));
          tcg_temp_free_internal_x86_64(pTVar1,(TCGTemp *)(pTVar7 + (long)pTVar1));
          tcg_temp_free_internal_x86_64(pTVar1,(TCGTemp *)(pTVar6 + (long)pTVar1));
          tcg_temp_free_internal_x86_64(pTVar1,(TCGTemp *)(pTVar5 + (long)pTVar1));
        }
        plVar4 = plVar4->next;
      } while (plVar4 != (list_item *)0x0);
    }
    gen_op_update2_cc(s1);
    goto LAB_00532bf4;
  case 6:
    if ((s1->prefix & 4) == 0) {
      pTVar9 = s1->T0 + (long)pTVar1;
      pTVar10 = s1->T1 + (long)pTVar1;
      opc = INDEX_op_xor_i64;
      goto LAB_005324fb;
    }
    tcg_gen_atomic_xor_fetch_i64_x86_64(pTVar1,s1->T0,s1->A0,s1->T1,(long)s1->mem_index,ot);
    break;
  case 7:
    if (pTVar1->cpu_cc_src != s1->T1) {
      tcg_gen_op2_x86_64(pTVar1,INDEX_op_mov_i64,(TCGArg)(pTVar1->cpu_cc_src + (long)pTVar1),
                         (TCGArg)(s1->T1 + (long)pTVar1));
    }
    if (s1->cc_srcT != s1->T0) {
      tcg_gen_op2_x86_64(pTVar1,INDEX_op_mov_i64,(TCGArg)(s1->cc_srcT + (long)pTVar1),
                         (TCGArg)(s1->T0 + (long)pTVar1));
    }
    tcg_gen_sub_i64(pTVar1,pTVar1->cpu_cc_dst,s1->T0,s1->T1);
    plVar4 = val->hook[0x10].head;
    bVar11 = plVar4 != (list_item *)0x0;
    if (bVar11) {
      do {
        pvVar2 = plVar4->data;
        if ((((*(ulong *)((long)pvVar2 + 0x18) <= s1->pc_start) &&
             (s1->pc_start <= *(ulong *)((long)pvVar2 + 0x20))) ||
            (*(ulong *)((long)pvVar2 + 0x20) < *(ulong *)((long)pvVar2 + 0x18))) &&
           (*(char *)((long)pvVar2 + 0x14) != '\x01')) break;
        plVar4 = plVar4->next;
        bVar11 = plVar4 != (list_item *)0x0;
      } while (bVar11);
    }
    if ((bVar11) && (plVar4 = val->hook[0x10].head, plVar4 != (list_item *)0x0)) {
      do {
        pvVar2 = plVar4->data;
        if (pvVar2 == (void *)0x0) break;
        if (((*(char *)((long)pvVar2 + 0x14) == '\0') && (*(int *)((long)pvVar2 + 0xc) == 0)) &&
           ((*(byte *)((long)pvVar2 + 0x10) & 1) != 0)) {
          tVar3 = s1->pc_start;
          pTVar9 = s1->T0;
          pTVar10 = s1->T1;
          pTVar5 = tcg_const_i64_x86_64(pTVar1,(int64_t)pvVar2);
          pTVar6 = tcg_const_i64_x86_64(pTVar1,(int64_t)val);
          pTVar7 = tcg_const_i64_x86_64(pTVar1,tVar3);
          pTVar8 = tcg_const_i32_x86_64(pTVar1,8 << ((byte)ot & 3));
          local_68 = (TCGTemp *)(pTVar5 + (long)pTVar1);
          local_60 = pTVar9 + (long)pTVar1;
          local_58 = pTVar10 + (long)pTVar1;
          local_50 = (TCGTemp *)(pTVar8 + (long)pTVar1);
          local_48 = (TCGTemp *)(pTVar6 + (long)pTVar1);
          local_40 = (TCGTemp *)(pTVar7 + (long)pTVar1);
          tcg_gen_callN_x86_64(pTVar1,helper_uc_traceopcode,(TCGTemp *)0x0,6,&local_68);
          tcg_temp_free_internal_x86_64(pTVar1,(TCGTemp *)(pTVar8 + (long)pTVar1));
          tcg_temp_free_internal_x86_64(pTVar1,(TCGTemp *)(pTVar7 + (long)pTVar1));
          tcg_temp_free_internal_x86_64(pTVar1,(TCGTemp *)(pTVar6 + (long)pTVar1));
          tcg_temp_free_internal_x86_64(pTVar1,(TCGTemp *)(pTVar5 + (long)pTVar1));
        }
        plVar4 = plVar4->next;
      } while (plVar4 != (list_item *)0x0);
    }
LAB_00532bf4:
    set_cc_op(s1,ot + MO_BESL);
    return;
  }
  pTVar1 = s1->uc->tcg_ctx;
  if (pTVar1->cpu_cc_dst != s1->T0) {
    tcg_gen_op2_x86_64(pTVar1,INDEX_op_mov_i64,(TCGArg)(pTVar1->cpu_cc_dst + (long)pTVar1),
                       (TCGArg)(s1->T0 + (long)pTVar1));
  }
  op_00 = ot + (MO_ALIGN_2|MO_LESL);
LAB_005329eb:
  set_cc_op(s1,op_00);
  return;
}

Assistant:

static void gen_op(DisasContext *s1, int op, MemOp ot, int d)
{
    TCGContext *tcg_ctx = s1->uc->tcg_ctx;
    uc_engine *uc = s1->uc;

    if (d != OR_TMP0) {
        if (s1->prefix & PREFIX_LOCK) {
            /* Lock prefix when destination is not memory.  */
            gen_illegal_opcode(s1);
            return;
        }
        gen_op_mov_v_reg(s1, ot, s1->T0, d);
    } else if (!(s1->prefix & PREFIX_LOCK)) {
        gen_op_ld_v(s1, ot, s1->T0, s1->A0);
    }
    switch(op) {
    case OP_ADCL:
        gen_compute_eflags_c(s1, s1->tmp4);
        if (s1->prefix & PREFIX_LOCK) {
            tcg_gen_add_tl(tcg_ctx, s1->T0, s1->tmp4, s1->T1);
            tcg_gen_atomic_add_fetch_tl(tcg_ctx, s1->T0, s1->A0, s1->T0,
                                        s1->mem_index, ot | MO_LE);
        } else {
            tcg_gen_add_tl(tcg_ctx, s1->T0, s1->T0, s1->T1);
            tcg_gen_add_tl(tcg_ctx, s1->T0, s1->T0, s1->tmp4);
            gen_op_st_rm_T0_A0(s1, ot, d);
        }
        gen_op_update3_cc(s1, s1->tmp4);
        set_cc_op(s1, CC_OP_ADCB + ot);
        break;
    case OP_SBBL:
        gen_compute_eflags_c(s1, s1->tmp4);
        if (s1->prefix & PREFIX_LOCK) {
            tcg_gen_add_tl(tcg_ctx, s1->T0, s1->T1, s1->tmp4);
            tcg_gen_neg_tl(tcg_ctx, s1->T0, s1->T0);
            tcg_gen_atomic_add_fetch_tl(tcg_ctx, s1->T0, s1->A0, s1->T0,
                                        s1->mem_index, ot | MO_LE);
        } else {
            tcg_gen_sub_tl(tcg_ctx, s1->T0, s1->T0, s1->T1);
            tcg_gen_sub_tl(tcg_ctx, s1->T0, s1->T0, s1->tmp4);
            gen_op_st_rm_T0_A0(s1, ot, d);
        }
        gen_op_update3_cc(s1, s1->tmp4);
        set_cc_op(s1, CC_OP_SBBB + ot);
        break;
    case OP_ADDL:
        if (s1->prefix & PREFIX_LOCK) {
            tcg_gen_atomic_add_fetch_tl(tcg_ctx, s1->T0, s1->A0, s1->T1,
                                        s1->mem_index, ot | MO_LE);
        } else {
            tcg_gen_add_tl(tcg_ctx, s1->T0, s1->T0, s1->T1);
            gen_op_st_rm_T0_A0(s1, ot, d);
        }
        gen_op_update2_cc(s1);
        set_cc_op(s1, CC_OP_ADDB + ot);
        break;
    case OP_SUBL:
        if (s1->prefix & PREFIX_LOCK) {
            tcg_gen_neg_tl(tcg_ctx, s1->T0, s1->T1);
            tcg_gen_atomic_fetch_add_tl(tcg_ctx, s1->cc_srcT, s1->A0, s1->T0,
                                        s1->mem_index, ot | MO_LE);
            tcg_gen_sub_tl(tcg_ctx, s1->T0, s1->cc_srcT, s1->T1);
        } else {
            tcg_gen_mov_tl(tcg_ctx, s1->cc_srcT, s1->T0);
            tcg_gen_sub_tl(tcg_ctx, s1->T0, s1->T0, s1->T1);
            gen_op_st_rm_T0_A0(s1, ot, d);
        }
        
        if (HOOK_EXISTS_BOUNDED(uc, UC_HOOK_TCG_OPCODE, s1->pc_start)) {
            struct hook *hook;
            HOOK_FOREACH_VAR_DECLARE;
            HOOK_FOREACH(uc, hook, UC_HOOK_TCG_OPCODE) {
                if (hook->to_delete)
                    continue;
                if (hook->op == UC_TCG_OP_SUB && (hook->op_flags & UC_TCG_OP_FLAG_DIRECT) ) {
                    // TCGv is just an offset to tcg_ctx so it's safe to do so.
                    gen_uc_traceopcode(tcg_ctx, hook, (TCGv_i64)s1->T0, (TCGv_i64)s1->T1, 1 << ((ot & MO_SIZE) + 3), uc, s1->pc_start);
                }
            }
        }

        gen_op_update2_cc(s1);
        set_cc_op(s1, CC_OP_SUBB + ot);
        break;
    default:
    case OP_ANDL:
        if (s1->prefix & PREFIX_LOCK) {
            tcg_gen_atomic_and_fetch_tl(tcg_ctx, s1->T0, s1->A0, s1->T1,
                                        s1->mem_index, ot | MO_LE);
        } else {
            tcg_gen_and_tl(tcg_ctx, s1->T0, s1->T0, s1->T1);
            gen_op_st_rm_T0_A0(s1, ot, d);
        }
        gen_op_update1_cc(s1);
        set_cc_op(s1, CC_OP_LOGICB + ot);
        break;
    case OP_ORL:
        if (s1->prefix & PREFIX_LOCK) {
            tcg_gen_atomic_or_fetch_tl(tcg_ctx, s1->T0, s1->A0, s1->T1,
                                       s1->mem_index, ot | MO_LE);
        } else {
            tcg_gen_or_tl(tcg_ctx, s1->T0, s1->T0, s1->T1);
            gen_op_st_rm_T0_A0(s1, ot, d);
        }
        gen_op_update1_cc(s1);
        set_cc_op(s1, CC_OP_LOGICB + ot);
        break;
    case OP_XORL:
        if (s1->prefix & PREFIX_LOCK) {
            tcg_gen_atomic_xor_fetch_tl(tcg_ctx, s1->T0, s1->A0, s1->T1,
                                        s1->mem_index, ot | MO_LE);
        } else {
            tcg_gen_xor_tl(tcg_ctx, s1->T0, s1->T0, s1->T1);
            gen_op_st_rm_T0_A0(s1, ot, d);
        }
        gen_op_update1_cc(s1);
        set_cc_op(s1, CC_OP_LOGICB + ot);
        break;
    case OP_CMPL:
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_cc_src, s1->T1);
        tcg_gen_mov_tl(tcg_ctx, s1->cc_srcT, s1->T0);
        tcg_gen_sub_tl(tcg_ctx, tcg_ctx->cpu_cc_dst, s1->T0, s1->T1);

        if (HOOK_EXISTS_BOUNDED(uc, UC_HOOK_TCG_OPCODE, s1->pc_start)) {
            struct hook *hook;
            HOOK_FOREACH_VAR_DECLARE;
            HOOK_FOREACH(uc, hook, UC_HOOK_TCG_OPCODE) {
                if (hook->to_delete)
                    continue;
                if (hook->op == UC_TCG_OP_SUB && (hook->op_flags & UC_TCG_OP_FLAG_CMP) ) {
                    // TCGv is just an offset to tcg_ctx so it's safe to do so.
                    gen_uc_traceopcode(tcg_ctx, hook, (TCGv_i64)s1->T0, (TCGv_i64)s1->T1, 1 << ((ot & MO_SIZE) + 3), uc, s1->pc_start);
                }
            }
        }

        set_cc_op(s1, CC_OP_SUBB + ot);
        break;
    }
}